

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

iterator * __thiscall
pybind11::detail::values_and_holders::find
          (iterator *__return_storage_ptr__,values_and_holders *this,type_info *find_type)

{
  instance *piVar1;
  type_info **pptVar2;
  size_t sVar3;
  size_t sVar4;
  
  begin(__return_storage_ptr__,this);
  sVar3 = (long)(this->tinfo->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->tinfo->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3;
  sVar4 = (__return_storage_ptr__->curr).index;
  if ((sVar4 != sVar3) && ((__return_storage_ptr__->curr).type != find_type)) {
    piVar1 = __return_storage_ptr__->inst;
    do {
      sVar4 = sVar4 + 1;
      if ((piVar1->field_0x30 & 2) == 0) {
        pptVar2 = (__return_storage_ptr__->typeit)._M_current;
        (__return_storage_ptr__->curr).vh =
             (__return_storage_ptr__->curr).vh + (*pptVar2)->holder_size_in_ptrs + 1;
        (__return_storage_ptr__->typeit)._M_current = pptVar2 + 1;
        (__return_storage_ptr__->curr).type = pptVar2[1];
      }
      (__return_storage_ptr__->curr).index = sVar4;
    } while ((sVar3 != sVar4) && ((__return_storage_ptr__->curr).type != find_type));
  }
  return __return_storage_ptr__;
}

Assistant:

iterator find(const type_info *find_type) {
        auto it = begin(), endit = end();
        while (it != endit && it->type != find_type) ++it;
        return it;
    }